

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilterTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFilter_invertStrictMatching_TestShell::~TEST_TestFilter_invertStrictMatching_TestShell
          (TEST_TestFilter_invertStrictMatching_TestShell *this)

{
  TEST_TestFilter_invertStrictMatching_TestShell *this_local;
  
  ~TEST_TestFilter_invertStrictMatching_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestFilter, invertStrictMatching)
{
    TestFilter filter("filter");
    filter.invertMatching();
    filter.strictMatching();
    CHECK(!filter.match("filter"));
    CHECK(filter.match("filterr"));
    CHECK(filter.match(" filter"));
}